

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixLookAt(Matrix *__return_storage_ptr__,Vector3 eye,Vector3 target,Vector3 up)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar4 = eye.z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  fVar1 = eye.x;
  fVar3 = eye.y;
  fVar9 = fVar1 - target.x;
  fVar10 = fVar3 - target.y;
  fVar11 = fVar4 - target.z;
  fVar2 = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  fVar9 = fVar9 * fVar2;
  fVar10 = fVar10 * fVar2;
  fVar11 = fVar11 * fVar2;
  fVar12 = up.y * fVar11 - fVar10 * up.z;
  fVar8 = up.z * fVar9 - fVar11 * up.x;
  fVar7 = up.x * fVar10 - fVar9 * up.y;
  fVar2 = fVar7 * fVar7 + fVar12 * fVar12 + fVar8 * fVar8;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  fVar12 = fVar12 * fVar2;
  fVar8 = fVar8 * fVar2;
  fVar2 = fVar2 * fVar7;
  fVar7 = fVar10 * fVar2 - fVar8 * fVar11;
  fVar6 = fVar11 * fVar12 - fVar2 * fVar9;
  fVar5 = fVar9 * fVar8 + -fVar10 * fVar12;
  __return_storage_ptr__->m0 = fVar12;
  __return_storage_ptr__->m1 = fVar7;
  __return_storage_ptr__->m2 = fVar9;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m4 = fVar8;
  __return_storage_ptr__->m5 = fVar6;
  __return_storage_ptr__->m6 = fVar10;
  __return_storage_ptr__->m8 = fVar2;
  __return_storage_ptr__->m9 = fVar5;
  __return_storage_ptr__->m10 = fVar11;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  __return_storage_ptr__->m12 = -(fVar2 * fVar4 + fVar12 * fVar1 + fVar8 * fVar3);
  __return_storage_ptr__->m13 = -(fVar5 * fVar4 + fVar7 * fVar1 + fVar6 * fVar3);
  __return_storage_ptr__->m14 = -(fVar11 * fVar4 + fVar9 * fVar1 + fVar3 * fVar10);
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix MatrixLookAt(Vector3 eye, Vector3 target, Vector3 up)
{
    Matrix result = { 0 };

    float length = 0.0f;
    float ilength = 0.0f;

    // Vector3Subtract(eye, target)
    Vector3 vz = { eye.x - target.x, eye.y - target.y, eye.z - target.z };

    // Vector3Normalize(vz)
    Vector3 v = vz;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vz.x *= ilength;
    vz.y *= ilength;
    vz.z *= ilength;

    // Vector3CrossProduct(up, vz)
    Vector3 vx = { up.y*vz.z - up.z*vz.y, up.z*vz.x - up.x*vz.z, up.x*vz.y - up.y*vz.x };

    // Vector3Normalize(x)
    v = vx;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vx.x *= ilength;
    vx.y *= ilength;
    vx.z *= ilength;

    // Vector3CrossProduct(vz, vx)
    Vector3 vy = { vz.y*vx.z - vz.z*vx.y, vz.z*vx.x - vz.x*vx.z, vz.x*vx.y - vz.y*vx.x };

    result.m0 = vx.x;
    result.m1 = vy.x;
    result.m2 = vz.x;
    result.m3 = 0.0f;
    result.m4 = vx.y;
    result.m5 = vy.y;
    result.m6 = vz.y;
    result.m7 = 0.0f;
    result.m8 = vx.z;
    result.m9 = vy.z;
    result.m10 = vz.z;
    result.m11 = 0.0f;
    result.m12 = -(vx.x*eye.x + vx.y*eye.y + vx.z*eye.z);   // Vector3DotProduct(vx, eye)
    result.m13 = -(vy.x*eye.x + vy.y*eye.y + vy.z*eye.z);   // Vector3DotProduct(vy, eye)
    result.m14 = -(vz.x*eye.x + vz.y*eye.y + vz.z*eye.z);   // Vector3DotProduct(vz, eye)
    result.m15 = 1.0f;

    return result;
}